

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

void startDocumentTokenizer(void *ctx)

{
  int iVar1;
  
  *(undefined4 *)((long)ctx + 0x110) = 7;
  iVar1 = **(int **)((long)ctx + 0x1a8);
  if (iVar1 != 0) {
    *(int *)((long)ctx + 0x2f0) = iVar1;
    *(undefined8 *)((long)ctx + 0x120) = *(undefined8 *)(*(int **)((long)ctx + 0x1a8) + 2);
  }
  return;
}

Assistant:

static void
startDocumentTokenizer(void *ctx) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;

    ctxt->instate = XML_PARSER_CONTENT;

    if (config->dataState != 0) {
        ctxt->endCheckState = config->dataState;
        ctxt->name = config->startTag;
    }
}